

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  cmTarget *this_00;
  bool bVar1;
  iterator __pos;
  string *psVar2;
  cmSourcesWithOutput sources;
  cmSourceFile *sf;
  string fullname;
  cmSourcesWithOutput local_c8;
  undefined1 local_b0 [48];
  string local_80;
  cmAlphaNum local_60;
  
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>_>
          ::lower_bound(&(this->NameMap)._M_t,name);
  if ((_Rb_tree_header *)__pos._M_node != &(this->NameMap)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (__pos._M_node + 1),name);
    if (!bVar1) goto LAB_003d73f6;
  }
  cmLocalGenerator::GetSourcesWithOutput(&local_c8,this->LocalGenerator,name);
  if (local_c8.Source == (cmSourceFile *)0x0 && local_c8.Target == (cmTarget *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(name);
    if (!bVar1) {
      psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      local_b0._8_8_ = (psVar2->_M_dataplus)._M_p;
      local_b0._0_8_ = psVar2->_M_string_length;
      local_60.View_._M_str = local_60.Digits_;
      local_60.View_._M_len = 1;
      local_60.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_80,(cmAlphaNum *)local_b0,&local_60,name);
      psVar2 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath((string *)local_b0,&local_80,psVar2);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      cmLocalGenerator::GetSourcesWithOutput
                ((cmSourcesWithOutput *)local_b0,this->LocalGenerator,&local_80);
      local_c8.SourceIsByproduct = (bool)local_b0[0x10];
      local_c8.Target = (cmTarget *)local_b0._0_8_;
      local_c8.Source = (cmSourceFile *)local_b0._8_8_;
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  __pos = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourcesWithOutput>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
          ::_M_emplace_hint_unique<std::__cxx11::string_const&,cmSourcesWithOutput&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourcesWithOutput>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
                      *)&this->NameMap,__pos._M_node,name,&local_c8);
LAB_003d73f6:
  if (*(cmTarget **)(__pos._M_node + 2) != (cmTarget *)0x0) {
    this_00 = this->GeneratorTarget->Target;
    psVar2 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(__pos._M_node + 2));
    cmTarget::AddUtility(this_00,psVar2,false,(cmMakefile *)0x0);
  }
  local_b0._0_8_ = __pos._M_node[2]._M_parent;
  if (((cmSourceFile *)local_b0._0_8_ != (cmSourceFile *)0x0) &&
     (*(char *)&__pos._M_node[2]._M_left == '\0')) {
    if (this->CurrentEntry != (SourceEntry *)0x0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                (&this->CurrentEntry->Depends,(value_type *)local_b0);
    }
    QueueSource(this,(cmSourceFile *)local_b0._0_8_);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  // Use lower bound with key comparison to not repeat the search for the
  // insert position if the name could not be found (which is the common case).
  auto i = this->NameMap.lower_bound(name);
  if (i == this->NameMap.end() || i->first != name) {
    // Check if we know how to generate this file.
    cmSourcesWithOutput sources =
      this->LocalGenerator->GetSourcesWithOutput(name);
    // If we failed to find a target or source and we have a relative path, it
    // might be a valid source if made relative to the current binary
    // directory.
    if (!sources.Target && !sources.Source &&
        !cmSystemTools::FileIsFullPath(name)) {
      auto fullname =
        cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/', name);
      fullname = cmSystemTools::CollapseFullPath(
        fullname, this->Makefile->GetHomeOutputDirectory());
      sources = this->LocalGenerator->GetSourcesWithOutput(fullname);
    }
    i = this->NameMap.emplace_hint(i, name, sources);
  }
  if (cmTarget* t = i->second.Target) {
    // The name is a byproduct of a utility target or a PRE_BUILD, PRE_LINK, or
    // POST_BUILD command.
    this->GeneratorTarget->Target->AddUtility(t->GetName(), false);
  }
  if (cmSourceFile* sf = i->second.Source) {
    // For now only follow the dependency if the source file is not a
    // byproduct.  Semantics of byproducts in a non-Ninja context will have to
    // be defined first.
    if (!i->second.SourceIsByproduct) {
      // Record the dependency we just followed.
      if (this->CurrentEntry) {
        this->CurrentEntry->Depends.push_back(sf);
      }
      this->QueueSource(sf);
    }
  }
}